

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O1

int_t cLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                float fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                singlecomplex **dwork)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ExpHeader *pEVar4;
  void *pvVar5;
  void *pvVar6;
  int_t *addr;
  int_t *addr_00;
  int_t iVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  int *piVar11;
  int_t *piVar12;
  int n_00;
  ulong uVar13;
  int_t *piVar14;
  int_t nzlumax;
  int_t nzumax;
  int_t nzlmax;
  int local_178;
  int local_174;
  int_t *local_170;
  int local_168;
  int_t local_164;
  ulong local_160;
  int_t *local_158;
  int_t *local_150;
  int *local_148;
  int *local_140;
  int local_138 [66];
  
  local_170 = (int_t *)CONCAT44(local_170._4_4_,fill_ratio);
  uVar13 = (ulong)(uint)n;
  Glu->n = n;
  Glu->num_expansions = 0;
  local_168 = m;
  local_164 = annz;
  pEVar4 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar4;
  if (pEVar4 == (ExpHeader *)0x0) {
    sprintf((char *)local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4
            ,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cmemory.c");
    superlu_abort_and_exit((char *)local_138);
  }
  local_160 = uVar13;
  if (fact == SamePattern_SameRowPerm) {
    pvVar5 = L->Store;
    pvVar6 = U->Store;
    piVar10 = *(int **)((long)pvVar5 + 0x30);
    piVar11 = *(int **)((long)pvVar5 + 0x28);
    piVar14 = *(int_t **)((long)pvVar5 + 0x10);
    piVar12 = *(int_t **)((long)pvVar5 + 0x20);
    local_170 = *(int_t **)((long)pvVar6 + 0x18);
    local_138[0] = Glu->nzlmax;
    local_174 = Glu->nzumax;
    local_178 = Glu->nzlumax;
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return n * 0x15 + (local_138[0] + (panel_size * 2 + 7) * local_168) * 4 + local_174 * 0xc +
               (panel_size + 1) * local_168 * 8 + local_178 * 8 + 0x14;
      }
      uVar9 = lwork + 3;
      if (-1 < lwork) {
        uVar9 = lwork;
      }
      Glu->MemModel = USER;
      (Glu->stack).top2 = uVar9 & 0xfffffffc;
      (Glu->stack).size = uVar9 & 0xfffffffc;
    }
    addr = *(int_t **)((long)pvVar5 + 0x18);
    pEVar4 = Glu->expanders;
    pEVar4[2].mem = addr;
    pvVar5 = *(void **)((long)pvVar5 + 8);
    pEVar4->mem = pvVar5;
    addr_00 = *(int_t **)((long)pvVar6 + 0x10);
    pEVar4[3].mem = addr_00;
    pvVar6 = *(void **)((long)pvVar6 + 8);
    pEVar4[1].mem = pvVar6;
    pEVar4[2].size = local_138[0];
    pEVar4->size = local_178;
    pEVar4[3].size = local_174;
    pEVar4[1].size = local_174;
  }
  else {
    local_178 = (int)((float)local_164 * local_170._0_4_);
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return (panel_size * 0x10 + 0x24) * local_168 + n * 0x15 + local_178 * 0x18 + 0x14;
      }
      if (0 < lwork) {
        Glu->MemModel = USER;
        (Glu->stack).used = 0;
        (Glu->stack).top1 = 0;
        (Glu->stack).top2 = lwork & 0x7ffffffcU;
        (Glu->stack).size = lwork & 0x7ffffffcU;
        (Glu->stack).array = work;
      }
    }
    local_174 = local_178;
    local_138[0] = local_178;
    if (Glu->MemModel == SYSTEM) {
      iVar2 = n + 1;
      local_140 = int32Malloc(iVar2);
      local_148 = int32Malloc(iVar2);
      local_150 = intMalloc(iVar2);
      local_158 = intMalloc(iVar2);
      local_170 = intMalloc(iVar2);
    }
    else {
      iVar1 = n * 4 + 4;
      iVar8 = (Glu->stack).used + iVar1;
      iVar2 = (Glu->stack).size;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_140 = (int *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_140 = (int *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_148 = (int *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_148 = (int *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_150 = (int_t *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_150 = (int_t *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar3 = (Glu->stack).top1;
        local_158 = (int_t *)((long)iVar3 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar3 + iVar1;
        (Glu->stack).used = iVar8;
      }
      else {
        local_158 = (int_t *)0x0;
      }
      iVar8 = (Glu->stack).used + iVar1;
      if (iVar8 < iVar2) {
        iVar2 = (Glu->stack).top1;
        local_170 = (int_t *)((long)iVar2 + (long)(Glu->stack).array);
        (Glu->stack).top1 = iVar1 + iVar2;
        (Glu->stack).used = iVar8;
      }
      else {
        local_170 = (int_t *)0x0;
      }
    }
    pvVar5 = cexpand(&local_178,LUSUP,0,0,Glu);
    pvVar6 = cexpand(&local_174,UCOL,0,0,Glu);
    addr = (int_t *)cexpand(local_138,LSUB,0,0,Glu);
    addr_00 = (int_t *)cexpand(&local_174,USUB,0,1,Glu);
    piVar10 = local_140;
    piVar11 = local_148;
    piVar12 = local_150;
    piVar14 = local_158;
    if ((addr_00 == (int_t *)0x0 || addr == (int_t *)0x0) ||
        (pvVar6 == (void *)0x0 || pvVar5 == (void *)0x0)) {
      do {
        if (Glu->MemModel == SYSTEM) {
          superlu_free(pvVar5);
          superlu_free(pvVar6);
          superlu_free(addr);
          superlu_free(addr_00);
        }
        else {
          iVar2 = local_178 * 8 + local_174 * 0xc + local_138[0] * 4;
          piVar14 = &(Glu->stack).top1;
          *piVar14 = *piVar14 - iVar2;
          piVar14 = &(Glu->stack).used;
          *piVar14 = *piVar14 - iVar2;
        }
        iVar2 = local_178 / 2;
        iVar8 = local_174 / 2;
        iVar1 = local_138[0] / 2;
        local_178 = iVar2;
        local_174 = iVar8;
        local_138[0] = iVar1;
        if (iVar2 < local_164) {
          puts("Not enough memory to perform factorization.");
          return (int)local_160 * 0x29 + iVar2 * 8 + iVar8 * 0xc + iVar1 * 4;
        }
        pvVar5 = cexpand(&local_178,LUSUP,0,0,Glu);
        pvVar6 = cexpand(&local_174,UCOL,0,0,Glu);
        addr = (int_t *)cexpand(local_138,LSUB,0,0,Glu);
        addr_00 = (int_t *)cexpand(&local_174,USUB,0,1,Glu);
        piVar10 = local_140;
        piVar11 = local_148;
        piVar12 = local_150;
        piVar14 = local_158;
      } while ((addr_00 == (int_t *)0x0 || addr == (int_t *)0x0) ||
               (pvVar6 == (void *)0x0 || pvVar5 == (void *)0x0));
    }
  }
  iVar8 = local_138[0];
  iVar1 = local_174;
  iVar2 = local_178;
  Glu->xsup = piVar10;
  Glu->supno = piVar11;
  Glu->lsub = addr;
  Glu->xlsub = piVar12;
  Glu->lusup = pvVar5;
  Glu->xlusup = piVar14;
  Glu->ucol = pvVar6;
  Glu->usub = addr_00;
  Glu->xusub = local_170;
  Glu->nzlmax = local_138[0];
  Glu->nzumax = local_174;
  Glu->nzlumax = local_178;
  n_00 = (int)local_160;
  iVar3 = cLUWorkInit(local_168,n_00,panel_size,iwork,dwork,Glu);
  if (iVar3 == 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
    iVar7 = 0;
  }
  else {
    iVar7 = n_00 * 0x29 + iVar8 * 4 + iVar1 * 0xc + iVar2 * 8 + iVar3;
  }
  return iVar7;
}

Assistant:

int_t
cLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, float fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, singlecomplex **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    singlecomplex   *lusup;
    int_t    *xlusup;
    singlecomplex   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(singlecomplex);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    cSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("cLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)cuser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)cuser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = cuser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = cuser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = cuser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (singlecomplex *) cexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (singlecomplex *) cexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) cexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) cexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		cuser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (cmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("cLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (singlecomplex *) cexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (singlecomplex *) cexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) cexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) cexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = cLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + cmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}